

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LTMain.cpp
# Opt level: O1

string * DecodeBase64(string *__return_storage_ptr__,string *_encoded)

{
  uint uVar1;
  int iVar2;
  char *bufplain;
  
  uVar1 = Base64decode_len((_encoded->_M_dataplus)._M_p);
  bufplain = (char *)operator_new__((ulong)uVar1);
  iVar2 = Base64decode(bufplain,(_encoded->_M_dataplus)._M_p);
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)__return_storage_ptr__,bufplain,bufplain + iVar2);
  operator_delete__(bufplain);
  return __return_storage_ptr__;
}

Assistant:

std::string DecodeBase64 (const std::string& _encoded)
{
    // create a buffer for the result and do the decoding
    char* buf = new char [(unsigned)Base64decode_len(_encoded.c_str())];
    const int len = Base64decode(buf, _encoded.c_str());
    std::string ret (buf, (size_t)len);
    delete [] buf;
    return ret;
}